

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O0

void Pf_CutParams(Pf_Man_t *p,Pf_Cut_t *pCut,int nGiaRefs)

{
  uint nLeaves_00;
  int b;
  int iVar1;
  float fVar2;
  int local_34;
  int local_20;
  int nLeaves;
  int i;
  int nGiaRefs_local;
  Pf_Cut_t *pCut_local;
  Pf_Man_t *p_local;
  
  nLeaves_00 = *(uint *)&pCut->field_0x10 >> 0x1b;
  if (p->pPars->nLutSize < (int)nLeaves_00) {
    __assert_fail("nLeaves <= p->pPars->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                  ,0x2fe,"void Pf_CutParams(Pf_Man_t *, Pf_Cut_t *, int)");
  }
  pCut->Delay = 0;
  pCut->Flow = 0.0;
  for (local_20 = 0; local_20 < (int)nLeaves_00; local_20 = local_20 + 1) {
    iVar1 = pCut->Delay;
    b = Pf_ObjCutDelay(p,pCut->pLeaves[local_20]);
    iVar1 = Abc_MaxInt(iVar1,b);
    pCut->Delay = iVar1;
    fVar2 = Pf_ObjCutFlow(p,pCut->pLeaves[local_20]);
    pCut->Flow = fVar2 + pCut->Flow;
  }
  pCut->Delay = (uint)(1 < nLeaves_00) + pCut->Delay;
  fVar2 = pCut->Flow;
  iVar1 = Pf_CutArea(p,nLeaves_00);
  local_34 = nGiaRefs;
  if (nGiaRefs == 0) {
    local_34 = 1;
  }
  pCut->Flow = (fVar2 + (float)iVar1) / (float)local_34;
  return;
}

Assistant:

static inline void Pf_CutParams( Pf_Man_t * p, Pf_Cut_t * pCut, int nGiaRefs )
{
    int i, nLeaves = pCut->nLeaves; 
    assert( nLeaves <= p->pPars->nLutSize );
    pCut->Delay = 0;
    pCut->Flow  = 0;
    for ( i = 0; i < nLeaves; i++ )
    {
        pCut->Delay = Abc_MaxInt( pCut->Delay, Pf_ObjCutDelay(p, pCut->pLeaves[i]) );
        pCut->Flow += Pf_ObjCutFlow(p, pCut->pLeaves[i]);
    }
    pCut->Delay += (int)(nLeaves > 1);
    pCut->Flow = (pCut->Flow + Pf_CutArea(p, nLeaves)) / (nGiaRefs ? nGiaRefs : 1);
}